

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall
GEO::geofile::import_plane_surface
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  uint uVar1;
  uint uVar2;
  pointer pbVar3;
  char *pcVar4;
  bool bVar5;
  ostream *poVar6;
  uint *puVar7;
  undefined8 uVar8;
  pointer pbVar9;
  pointer n;
  bool bVar10;
  double dVar11;
  double dVar12;
  pair<const_int,_int> local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(split_string_vector,
             (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(split_string_vector,
             (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1);
  pbVar3 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar9) {
    bVar10 = true;
    n = pbVar3;
    do {
      bVar5 = is_integer(n);
      if (!bVar5) {
        bVar10 = false;
      }
      n = n + 1;
    } while (n != pbVar9);
    if (!bVar10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: Invalid value (line ",0x1b);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*line_number);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," of ",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(import_path->_M_dataplus)._M_p,import_path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      return 1;
    }
  }
  pcVar4 = (pbVar3->_M_dataplus)._M_p;
  puVar7 = (uint *)__errno_location();
  uVar1 = *puVar7;
  *puVar7 = 0;
  dVar11 = strtod(pcVar4,(char **)&local_38);
  if ((char *)CONCAT44(local_38.second,local_38.first) == pcVar4) {
    std::__throw_invalid_argument("stod");
    goto LAB_0012cf8a;
  }
  uVar2 = *puVar7;
  if (uVar2 == 0) {
LAB_0012cf08:
    *puVar7 = uVar1;
    uVar2 = uVar1;
  }
  else if (uVar2 == 0x22) {
    std::__throw_out_of_range("stod");
    goto LAB_0012cf08;
  }
  pbVar9 = (pointer)(ulong)uVar2;
  pcVar4 = pbVar3[1]._M_dataplus._M_p;
  *puVar7 = 0;
  dVar12 = strtod(pcVar4,(char **)&local_38);
  if ((char *)CONCAT44(local_38.second,local_38.first) == pcVar4) {
LAB_0012cf8a:
    uVar8 = std::__throw_invalid_argument("stod");
    if (*puVar7 == 0) {
      *puVar7 = (uint)pbVar9;
    }
    _Unwind_Resume(uVar8);
  }
  if (*puVar7 != 0) {
    if (*puVar7 != 0x22) goto LAB_0012cf4a;
    dVar12 = (double)std::__throw_out_of_range("stod");
  }
  *puVar7 = uVar2;
LAB_0012cf4a:
  local_38.first = (int)dVar11;
  local_38.second = (int)dVar12;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&this->plane_surfaces_map,&local_38);
  return 0;
}

Assistant:

int GEO::geofile::import_plane_surface( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    auto it = split_string_vector.begin();
    split_string_vector.erase(it);
    it = std::prev(split_string_vector.end(),1);
    split_string_vector.erase(it);
    it = split_string_vector.begin();
    bool proceed = true;
    auto ssv_end = split_string_vector.end();
    while (it!=ssv_end)
    {
        if (!is_integer(*it)) proceed = false;
        it++;
    }
    if (proceed==false)
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
    it = split_string_vector.begin();
    int key = std::stod(*it);
    it++;
    plane_surfaces_map.insert({key,std::stod(*it)});
    return EXIT_SUCCESS;
}